

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  ModuleHeaderSyntax *pMVar1;
  Token TVar2;
  Token TVar3;
  BumpAllocator *in_stack_00000008;
  SyntaxList<slang::syntax::PackageImportDeclarationSyntax> *in_stack_00000010;
  ParameterPortListSyntax **in_stack_00000020;
  PortListSyntax **in_stack_00000028;
  Token *in_stack_00000030;
  BumpAllocator *in_stack_000000a8;
  Token *in_stack_000000b0;
  BumpAllocator *in_stack_ffffffffffffff58;
  ParameterPortListSyntax *in_stack_ffffffffffffff60;
  
  TVar2 = parsing::Token::deepClone(in_stack_000000b0,in_stack_000000a8);
  TVar3 = parsing::Token::deepClone(in_stack_000000b0,in_stack_000000a8);
  parsing::Token::deepClone(in_stack_000000b0,in_stack_000000a8);
  deepClone<slang::syntax::PackageImportDeclarationSyntax>(in_stack_00000010,in_stack_00000008);
  if (((BumpAllocator *)((long)__fn + 0x80))->head != (Segment *)0x0) {
    deepClone<slang::syntax::ParameterPortListSyntax>
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  }
  if (((BumpAllocator *)((long)__fn + 0x80))->endPtr != (byte *)0x0) {
    deepClone<slang::syntax::PortListSyntax>
              ((PortListSyntax *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  }
  parsing::Token::deepClone(in_stack_000000b0,in_stack_000000a8);
  pMVar1 = BumpAllocator::
           emplace<slang::syntax::ModuleHeaderSyntax,slang::syntax::SyntaxKind_const&,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::PackageImportDeclarationSyntax>&,slang::syntax::ParameterPortListSyntax*,slang::syntax::PortListSyntax*,slang::parsing::Token>
                     ((BumpAllocator *)__fn,(SyntaxKind *)__child_stack,(Token *)TVar2.info,
                      TVar2._0_8_,(Token *)TVar3.info,TVar3._0_8_,in_stack_00000020,
                      in_stack_00000028,in_stack_00000030);
  return (int)pMVar1;
}

Assistant:

static SyntaxNode* clone(const ModuleHeaderSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ModuleHeaderSyntax>(
        node.kind,
        node.moduleKeyword.deepClone(alloc),
        node.lifetime.deepClone(alloc),
        node.name.deepClone(alloc),
        *deepClone(node.imports, alloc),
        node.parameters ? deepClone(*node.parameters, alloc) : nullptr,
        node.ports ? deepClone(*node.ports, alloc) : nullptr,
        node.semi.deepClone(alloc)
    );
}